

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr_cnv.cpp
# Opt level: O3

UConverter * u_getDefaultConverter_63(UErrorCode *status)

{
  UConverter *pUVar1;
  
  if (gDefaultConverter != (UConverter *)0x0) {
    umtx_lock_63((UMutex *)0x0);
    pUVar1 = gDefaultConverter;
    if (gDefaultConverter != (UConverter *)0x0) {
      gDefaultConverter = (UConverter *)0x0;
      umtx_unlock_63((UMutex *)0x0);
      return pUVar1;
    }
    umtx_unlock_63((UMutex *)0x0);
  }
  pUVar1 = ucnv_open_63((char *)0x0,status);
  if (U_ZERO_ERROR < *status) {
    ucnv_close_63(pUVar1);
    pUVar1 = (UConverter *)0x0;
  }
  return pUVar1;
}

Assistant:

U_CAPI UConverter* U_EXPORT2
u_getDefaultConverter(UErrorCode *status)
{
    UConverter *converter = NULL;
    
    if (gDefaultConverter != NULL) {
        umtx_lock(NULL);
        
        /* need to check to make sure it wasn't taken out from under us */
        if (gDefaultConverter != NULL) {
            converter = gDefaultConverter;
            gDefaultConverter = NULL;
        }
        umtx_unlock(NULL);
    }

    /* if the cache was empty, create a converter */
    if(converter == NULL) {
        converter = ucnv_open(NULL, status);
        if(U_FAILURE(*status)) {
            ucnv_close(converter);
            converter = NULL;
        }
    }

    return converter;
}